

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ActiveAttributesCase::test(ActiveAttributesCase *this)

{
  TestContext *pTVar1;
  GLenum GVar2;
  GLuint program_00;
  int iVar3;
  deBool dVar4;
  GLint GVar5;
  qpTestResult qVar6;
  TestLog *this_00;
  MessageBuilder *this_01;
  CallLogWrapper *this_02;
  GLenum local_1244 [2];
  GLenum type_1;
  GLint size_1;
  GLint written_1;
  char buffer_1 [2048];
  allocator<char> local_8b1;
  string local_8b0 [39];
  allocator<char> local_889;
  string local_888 [36];
  GLenum local_864 [2];
  GLenum type;
  GLint size;
  GLint written;
  char buffer [2048];
  int attributeNdx;
  allocator<char> local_41;
  string local_40 [36];
  GLuint local_1c;
  GLuint local_18;
  GLuint program;
  GLuint shaderFrag;
  GLuint shaderVert;
  ActiveAttributesCase *this_local;
  
  this_02 = &(this->super_ApiCase).super_CallLogWrapper;
  _shaderFrag = this;
  program = glu::CallLogWrapper::glCreateShader(this_02,0x8b31);
  local_18 = glu::CallLogWrapper::glCreateShader(this_02,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_02,program,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_02,local_18,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_02,program);
  glu::CallLogWrapper::glCompileShader(this_02,local_18);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_1c = glu::CallLogWrapper::glCreateProgram(this_02);
  glu::CallLogWrapper::glAttachShader(this_02,local_1c,program);
  glu::CallLogWrapper::glAttachShader(this_02,local_1c,local_18);
  glu::CallLogWrapper::glLinkProgram(this_02,local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_02,local_1c,0x8b89,2);
  program_00 = local_1c;
  pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"longInputAttributeName",&local_41);
  iVar3 = std::__cxx11::string::length();
  verifyProgramParam(pTVar1,this_02,program_00,0x8b8a,iVar3 + 1);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  buffer[0x7f8] = '\0';
  buffer[0x7f9] = '\0';
  buffer[0x7fa] = '\0';
  buffer[0x7fb] = '\0';
  for (; (int)buffer._2040_4_ < 2; buffer._2040_4_ = buffer._2040_4_ + 1) {
    memset(&size,0,0x800);
    size._0_1_ = 0x78;
    type = 0;
    local_864[1] = 0;
    local_864[0] = 0;
    glu::CallLogWrapper::glGetActiveAttrib
              (&(this->super_ApiCase).super_CallLogWrapper,local_1c,buffer._2040_4_,0x800,
               (GLsizei *)&type,(GLint *)(local_864 + 1),local_864,(GLchar *)&size);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar4 = deStringBeginsWith((char *)&size,"longInputAttributeName");
    GVar2 = type;
    if (dVar4 == 0) {
      dVar4 = deStringBeginsWith((char *)&size,"shortName");
      GVar2 = type;
      if (dVar4 == 0) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                             m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)(buffer_1 + 0x7f8),this_00,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        this_01 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)(buffer_1 + 0x7f8),
                             (char (*) [41])"// ERROR: Got unexpected attribute name.");
        tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(buffer_1 + 0x7f8));
        qVar6 = tcu::TestContext::getTestResult
                          ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
        if (qVar6 == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult
                    ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"got unexpected name");
        }
      }
      else {
        pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_8b0,"shortName",&local_8b1);
        GVar5 = std::__cxx11::string::length();
        checkIntEquals(pTVar1,GVar2,GVar5);
        std::__cxx11::string::~string(local_8b0);
        std::allocator<char>::~allocator(&local_8b1);
      }
    }
    else {
      pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_888,"longInputAttributeName",&local_889);
      GVar5 = std::__cxx11::string::length();
      checkIntEquals(pTVar1,GVar2,GVar5);
      std::__cxx11::string::~string(local_888);
      std::allocator<char>::~allocator(&local_889);
    }
  }
  memset(&size_1,0,0x800);
  size_1._0_1_ = 0x78;
  type_1 = 0;
  local_1244[1] = 0;
  local_1244[0] = 0;
  glu::CallLogWrapper::glGetActiveAttrib
            (&(this->super_ApiCase).super_CallLogWrapper,local_1c,0,1,(GLsizei *)&type_1,
             (GLint *)(local_1244 + 1),local_1244,(GLchar *)&size_1);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkIntEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,type_1
                 ,0);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,local_18);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,local_1c);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* testVertSource =
			"#version 300 es\n"
			"in highp vec2 longInputAttributeName;\n"
			"in highp vec2 shortName;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = longInputAttributeName.yxxy + shortName.xyxy;\n"
			"}\n\0";
		static const char* testFragSource =
			"#version 300 es\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_ATTRIBUTES, 2);
		verifyProgramParam(m_testCtx, *this, program, GL_ACTIVE_ATTRIBUTE_MAX_LENGTH, (GLint)std::string("longInputAttributeName").length() + 1); // does include null-terminator

		// check names
		for (int attributeNdx = 0; attributeNdx < 2; ++attributeNdx)
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			GLint size = 0;
			GLenum type = 0;
			glGetActiveAttrib(program, attributeNdx, DE_LENGTH_OF_ARRAY(buffer), &written, &size, &type, buffer);
			expectError(GL_NO_ERROR);

			if (deStringBeginsWith(buffer, "longInputAttributeName"))
			{
				checkIntEquals(m_testCtx, written, (GLint)std::string("longInputAttributeName").length()); // does NOT include null-terminator
			}
			else if (deStringBeginsWith(buffer, "shortName"))
			{
				checkIntEquals(m_testCtx, written, (GLint)std::string("shortName").length()); // does NOT include null-terminator
			}
			else
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Got unexpected attribute name." << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected name");
			}
		}

		// and with too short buffer
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			GLint size = 0;
			GLenum type = 0;

			glGetActiveAttrib(program, 0, 1, &written, &size, &type, buffer);
			expectError(GL_NO_ERROR);
			checkIntEquals(m_testCtx, written, 0);
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}